

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O2

bool __thiscall ExecutorX86::AddBreakpoint(ExecutorX86 *this,uint instruction,bool oneHit)

{
  FastVector<unsigned_char_*,_false,_false> *this_00;
  uint uVar1;
  Breakpoint in_RAX;
  uchar **ppuVar2;
  Breakpoint local_28;
  
  uVar1 = (this->instAddress).count;
  if (instruction <= uVar1) {
    this_00 = &this->instAddress;
    local_28 = in_RAX;
    for (; instruction < uVar1; instruction = instruction + 1) {
      ppuVar2 = FastVector<unsigned_char_*,_false,_false>::operator[](this_00,instruction);
      uVar1 = (this->instAddress).count;
      if (*ppuVar2 != (uchar *)0x0) break;
    }
    if (instruction < uVar1) {
      ppuVar2 = FastVector<unsigned_char_*,_false,_false>::operator[](this_00,instruction);
      local_28.oldOpcode = **ppuVar2;
      local_28.instIndex = instruction;
      local_28.oneHit = oneHit;
      FastVector<ExecutorX86::Breakpoint,_false,_false>::push_back
                (&this->breakInstructions,&local_28);
      ppuVar2 = FastVector<unsigned_char_*,_false,_false>::operator[](this_00,instruction);
      **ppuVar2 = 0xcc;
      return true;
    }
  }
  NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"ERROR: break position out of code range");
  this->execErrorMessage = this->execErrorBuffer;
  return false;
}

Assistant:

bool ExecutorX86::AddBreakpoint(unsigned int instruction, bool oneHit)
{
	if(instruction > instAddress.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	while(instruction < instAddress.size() && !instAddress[instruction])
		instruction++;

	if(instruction >= instAddress.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	breakInstructions.push_back(Breakpoint(instruction, *instAddress[instruction], oneHit));
	*instAddress[instruction] = 0xcc;
	return true;
}